

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

string * __thiscall
soul::TokenisedPathString::getLastPart_abi_cxx11_
          (string *__return_storage_ptr__,TokenisedPathString *this)

{
  Section *pSVar1;
  
  if ((this->sections).numActive == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pSVar1 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::back(&this->sections);
    getSection_abi_cxx11_(__return_storage_ptr__,this,*pSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLastPart() const
    {
        if (sections.empty())
            return {};

        return getSection (sections.back());
    }